

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  uchar *puVar1;
  char cVar2;
  byte bVar3;
  curl_trc_feat *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  char *in_RAX;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  size_t length;
  char *endp;
  char *local_38;
  
  local_38 = in_RAX;
  iVar6 = curl_strnequal(header,"CSeq:",5);
  if (iVar6 != 0) {
    for (pcVar15 = header + 5; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
    }
    lVar9 = strtol(pcVar15,&local_38,10);
    if (pcVar15 != local_38) {
      ((data->req).p.rtsp)->CSeq_recv = lVar9;
      (data->state).rtsp_CSeq_recv = lVar9;
      return CURLE_OK;
    }
    Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
    return CURLE_RTSP_CSEQ_ERROR;
  }
  iVar6 = curl_strnequal(header,"Session:",8);
  if (iVar6 == 0) {
    iVar6 = curl_strnequal(header,"Transport:",10);
    if (iVar6 == 0) {
      return CURLE_OK;
    }
    pcVar14 = header + 10;
    pcVar15 = pcVar14;
    while( true ) {
      if (*pcVar15 == '\0') {
        return CURLE_OK;
      }
      for (; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
      }
      pcVar11 = strchr(pcVar15,0x3b);
      iVar6 = curl_strnequal(pcVar15,"interleaved=",0xc);
      if (iVar6 != 0) break;
      pcVar15 = pcVar11 + 1;
      if (pcVar11 == (char *)0x0) {
        return CURLE_OK;
      }
    }
    uVar12 = strtol(pcVar15 + 0xc,&local_38,10);
    if (uVar12 < 0x100 && pcVar15 + 0xc != local_38) {
      uVar13 = uVar12;
      if ((((*local_38 == '-') &&
           (pcVar15 = local_38 + 1, uVar13 = strtol(pcVar15,&local_38,10),
           0xff < uVar13 || pcVar15 == local_38)) && (uVar13 = uVar12, data != (Curl_easy *)0x0)) &&
         ((((data->set).field_0x8cd & 0x10) != 0 &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ))) {
        Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",
                   pcVar14);
      }
      if ((long)uVar13 < (long)uVar12) {
        return CURLE_OK;
      }
      do {
        puVar1 = (data->state).rtp_channel_mask + (uVar12 >> 3);
        *puVar1 = *puVar1 | '\x01' << ((byte)uVar12 & 7);
        uVar12 = uVar12 + 1;
      } while (uVar13 + 1 != uVar12);
      return CURLE_OK;
    }
    if (data == (Curl_easy *)0x0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CURLE_OK;
    }
    pcVar4 = (data->state).feat;
    if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
      return CURLE_OK;
    }
    Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",pcVar14);
    return CURLE_OK;
  }
  for (pcVar15 = header + 8; (cVar2 = *pcVar15, cVar2 == '\t' || (cVar2 == ' '));
      pcVar15 = pcVar15 + 1) {
  }
  if (cVar2 == '\0') {
    Curl_failf(data,"Got a blank Session ID");
  }
  else {
    length = 0;
    while( true ) {
      bVar3 = pcVar15[length];
      if ((((ulong)bVar3 < 0x3c) && ((0x800000100000201U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
         (0xfb < (byte)(bVar3 - 0xe))) break;
      length = length + 1;
    }
    pcVar14 = (data->set).str[0x33];
    if (pcVar14 == (char *)0x0) {
      pcVar11 = (char *)Curl_memdup0(pcVar15,length);
      (data->set).str[0x33] = pcVar11;
      if (pcVar11 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
        bVar5 = false;
        goto LAB_0014e5a5;
      }
LAB_0014e5d6:
      CVar8 = (CURLcode)pcVar11;
      bVar5 = true;
      goto LAB_0014e5a5;
    }
    sVar10 = strlen(pcVar14);
    if (sVar10 == length) {
      uVar7 = strncmp(pcVar15,pcVar14,length);
      pcVar11 = (char *)(ulong)uVar7;
      if (uVar7 == 0) goto LAB_0014e5d6;
    }
    Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",pcVar15,pcVar14);
  }
  bVar5 = false;
  CVar8 = CURLE_RTSP_SESSION_ERROR;
LAB_0014e5a5:
  if (bVar5) {
    return CURLE_OK;
  }
  return CVar8;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    long CSeq = 0;
    char *endp;
    const char *p = &header[5];
    while(ISBLANK(*p))
      p++;
    CSeq = strtol(p, &endp, 10);
    if(p != endp) {
      struct RTSP *rtsp = data->req.p.rtsp;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISBLANK(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while(*end && *end != ';' && !ISSPACE(*end))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}